

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expected.h
# Opt level: O1

void __thiscall
Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::~Expected(Expected<ProjectSettings,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this)

{
  long *plVar1;
  long *plVar2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  if (this->has_value_ == true) {
    plVar2 = *(long **)((long)&this->field_0 + 0xb0);
    plVar1 = (long *)((long)&this->field_0 + 0xc0);
    if (plVar2 != plVar1) {
      operator_delete(plVar2,*plVar1 + 1);
    }
    plVar2 = *(long **)((long)&this->field_0 + 0x90);
    plVar1 = (long *)((long)&this->field_0 + 0xa0);
    if (plVar2 != plVar1) {
      operator_delete(plVar2,*plVar1 + 1);
    }
    plVar2 = *(long **)((long)&this->field_0 + 0x70);
    plVar1 = (long *)((long)&this->field_0 + 0x80);
    if (plVar2 != plVar1) {
      operator_delete(plVar2,*plVar1 + 1);
    }
    plVar2 = *(long **)((long)&this->field_0 + 0x48);
    plVar1 = (long *)((long)&this->field_0 + 0x58);
    if (plVar2 != plVar1) {
      operator_delete(plVar2,*plVar1 + 1);
    }
  }
  pcVar3 = (this->field_0).value_.video.config_filename._M_dataplus._M_p;
  paVar4 = &(this->field_0).value_.video.config_filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar4) {
    operator_delete(pcVar3,paVar4->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~Expected() {
		if (has_value_)
			value_.~T();
		else
			error_.~UnexpectedType();
	}